

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void ExprFreeTree(jx9_gen_state *pGen,jx9_expr_node *pNode)

{
  void *pvVar1;
  uint local_24;
  sxu32 n;
  jx9_expr_node **apArg;
  jx9_expr_node *pNode_local;
  jx9_gen_state *pGen_local;
  
  if (pNode->pLeft != (jx9_expr_node *)0x0) {
    ExprFreeTree(pGen,pNode->pLeft);
  }
  if (pNode->pRight != (jx9_expr_node *)0x0) {
    ExprFreeTree(pGen,pNode->pRight);
  }
  if (pNode->pCond != (jx9_expr_node *)0x0) {
    ExprFreeTree(pGen,pNode->pCond);
  }
  if ((pNode->aNodeArgs).nUsed != 0) {
    pvVar1 = (pNode->aNodeArgs).pBase;
    for (local_24 = 0; local_24 < (pNode->aNodeArgs).nUsed; local_24 = local_24 + 1) {
      ExprFreeTree(pGen,*(jx9_expr_node **)((long)pvVar1 + (ulong)local_24 * 8));
    }
    SySetRelease(&pNode->aNodeArgs);
  }
  SyMemBackendPoolFree(&pGen->pVm->sAllocator,pNode);
  return;
}

Assistant:

static void ExprFreeTree(jx9_gen_state *pGen, jx9_expr_node *pNode)
{
	if( pNode->pLeft ){
		/* Release the left tree */
		ExprFreeTree(&(*pGen), pNode->pLeft);
	}
	if( pNode->pRight ){
		/* Release the right tree */
		ExprFreeTree(&(*pGen), pNode->pRight);
	}
	if( pNode->pCond ){
		/* Release the conditional tree used by the ternary operator */
		ExprFreeTree(&(*pGen), pNode->pCond);
	}
	if( SySetUsed(&pNode->aNodeArgs) > 0 ){
		jx9_expr_node **apArg;
		sxu32 n;
		/* Release node arguments */
		apArg = (jx9_expr_node **)SySetBasePtr(&pNode->aNodeArgs);
		for( n = 0 ; n < SySetUsed(&pNode->aNodeArgs) ; ++n ){
			ExprFreeTree(&(*pGen), apArg[n]);
		}
		SySetRelease(&pNode->aNodeArgs);
	}
	/* Finally, release this node */
	SyMemBackendPoolFree(&pGen->pVm->sAllocator, pNode);
}